

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O2

uint __thiscall iff_chunk::get_chunk_count(iff_chunk *this,char *p_id)

{
  long lVar1;
  uint uVar2;
  pointer piVar3;
  bool bVar4;
  
  piVar3 = (this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar1 = ((long)(this->m_sub_chunks).super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) / 0x38;
  uVar2 = 0;
  while (bVar4 = lVar1 != 0, lVar1 = lVar1 + -1, bVar4) {
    uVar2 = uVar2 + (*(int *)p_id == *(int *)piVar3->m_id);
    piVar3 = piVar3 + 1;
  }
  return uVar2;
}

Assistant:

unsigned get_chunk_count( const char * p_id ) const
    {
        unsigned chunk_count = 0;
        for ( std::size_t i = 0; i < m_sub_chunks.size(); ++i )
        {
            if ( !memcmp( p_id, m_sub_chunks[ i ].m_id, 4 ) )
            {
                ++chunk_count;
            }
        }
        return chunk_count;
    }